

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_chain_constructors<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>
               (void)

{
  int iVar1;
  undefined1 auVar2 [8];
  undefined4 uVar3;
  Index local_6dc;
  undefined8 local_6d8;
  undefined4 *local_6d0;
  undefined4 ****local_6c8;
  char *local_6c0;
  shared_count sStack_6b8;
  undefined8 *local_6b0;
  undefined4 local_6a4;
  undefined4 **local_6a0;
  char *local_698;
  undefined8 local_690;
  char *local_688;
  shared_count sStack_680;
  undefined **local_678;
  char *local_670;
  undefined8 *local_668;
  undefined4 **local_660;
  undefined4 ***local_658;
  ulong local_650;
  shared_count sStack_648;
  char *local_640;
  undefined1 local_638 [8];
  Underlying_matrix local_630;
  undefined1 local_5a0 [8];
  undefined1 local_598 [8];
  undefined1 local_590 [16];
  _Manager_type local_580;
  _Invoker_type p_Stack_578;
  _Any_data local_570;
  _Manager_type local_560;
  _Invoker_type p_Stack_558;
  Matrix_row_access_option local_550;
  pointer pIStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  pointer local_520;
  Index local_518;
  Column_settings *local_510;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>
  mc1;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>
  mr;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ordered_boundaries;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>
  mc2;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>
  m;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>>
            ();
  local_598 = (undefined1  [8])0x0;
  local_5a0 = (undefined1  [8])birth_comp;
  local_590._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  local_590._0_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  mr.matrix_.super_Matrix_dimension_option.maxDim_ = 0;
  mr.matrix_._4_4_ = 0;
  mr.colSettings_ = (Column_settings *)death_comp;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = std::
              _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
              ::_M_manager;
  m.colSettings_ = (Column_settings *)operator_new(0x38);
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x30;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>
  ::
  Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>
              *)&m.matrix_,m.colSettings_,(function<bool_(unsigned_int,_unsigned_int)> *)local_5a0,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mr);
  if (mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_object != (void *)0x0) {
    (*mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_function_pointer)(&mr,&mr,3);
  }
  if ((_Manager_type)local_590._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_590._0_8_)(local_5a0,local_5a0,3);
  }
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d8,0x15f);
  mc1.matrix_._0_8_ = mc1.matrix_._0_8_ & 0xffffffffffffff00;
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_002230e0;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _0_8_ = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       (long)"  " + 2;
  local_6c8 = &local_658;
  local_658 = (undefined4 ***)CONCAT44(local_658._4_4_,m.matrix_.nextIndex_);
  local_678 = (undefined **)&local_690;
  mc2.colSettings_ = (Column_settings *)CONCAT71(mc2.colSettings_._1_7_,m.matrix_.nextIndex_ == 0);
  local_690 = (char *)((ulong)local_690._4_4_ << 0x20);
  mc2.matrix_.super_Matrix_dimension_option.maxDim_ = 0;
  mc2.matrix_._4_4_ = 0;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  local_638 = (undefined1  [8])0x1e62cd;
  local_630._0_8_ = "";
  local_590._8_8_ = &local_6c8;
  local_598 = (undefined1  [8])((ulong)local_598 & 0xffffffffffffff00);
  local_5a0 = (undefined1  [8])&PTR__lazy_ostream_00223050;
  local_590._0_8_ = &boost::unit_test::lazy_ostream::inst;
  mr.matrix_._0_8_ = mr.matrix_._0_8_ & 0xffffffffffffff00;
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_002230a0;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_678;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&mc2.matrix_.super_Chain_vine_swap_option);
  mr.matrix_.super_Matrix_dimension_option.maxDim_ = 0;
  mr.matrix_._4_4_ = 0;
  mr.colSettings_ = (Column_settings *)birth_comp;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = std::
              _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
              ::_M_manager;
  mc1.matrix_.super_Matrix_dimension_option.maxDim_ = 0;
  mc1.matrix_._4_4_ = 0;
  mc1.colSettings_ = (Column_settings *)death_comp;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = std::
              _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
              ::_M_manager;
  local_5a0 = (undefined1  [8])operator_new(0x38);
  (((Column_settings *)local_5a0)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (((Column_settings *)local_5a0)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  (((Column_settings *)local_5a0)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  (((Column_settings *)local_5a0)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x30;
  (((Column_settings *)local_5a0)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  (((Column_settings *)local_5a0)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  (((Column_settings *)local_5a0)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>
  ::
  Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>
              *)local_598,&ordered_boundaries,(Column_settings *)local_5a0,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mr,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mc1);
  if (mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_object != (void *)0x0) {
    (*mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_function_pointer)(&mc1,&mc1,3);
  }
  if (mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_object != (void *)0x0) {
    (*mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_function_pointer)(&mr,&mr,3);
  }
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f8,0x163);
  mc2.matrix_._0_8_ = mc2.matrix_._0_8_ & 0xffffffffffffff00;
  mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_002230e0;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _0_8_ = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       (long)"  " + 2;
  local_658 = &local_6a0;
  local_6a0._0_4_ = 7;
  local_630.super_Matrix_dimension_option.maxDim_ = 0;
  local_630._4_4_ = 0;
  local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  local_6c8 = (undefined4 ****)0x1e62cd;
  local_6c0 = "";
  local_678 = (undefined **)&local_690;
  mr.matrix_._0_8_ = mr.matrix_._0_8_ & 0xffffffffffffff00;
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00223050;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_._0_8_ = mc1.matrix_._0_8_ & 0xffffffffffffff00;
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_002230a0;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _0_8_ = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_658;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_678;
  local_638[0] = local_518 == 7;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_630.super_Chain_vine_swap_option);
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0x164);
  mc2.matrix_._0_8_ = mc2.matrix_._0_8_ & 0xffffffffffffff00;
  mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_002230e0;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _0_8_ = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       (long)"  " + 2;
  local_690._0_4_ = pIStack_548[2].super_Column_dimension_option.dim_;
  local_638[0] = (int)local_690 == 0;
  local_6a0._0_4_ = 0;
  local_630.super_Matrix_dimension_option.maxDim_ = 0;
  local_630._4_4_ = 0;
  local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  local_6c8 = (undefined4 ****)0x1e62cd;
  local_6c0 = "";
  local_678 = (undefined **)&local_690;
  mr.matrix_._0_8_ = mr.matrix_._0_8_ & 0xffffffffffffff00;
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_002230a0;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  local_658 = &local_6a0;
  mc1.matrix_._0_8_ = mc1.matrix_._0_8_ & 0xffffffffffffff00;
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_002230a0;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _0_8_ = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_658;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_678;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_630.super_Chain_vine_swap_option);
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_138,0x165);
  mc2.matrix_._0_8_ = mc2.matrix_._0_8_ & 0xffffffffffffff00;
  mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_002230e0;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _0_8_ = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       (long)"  " + 2;
  iVar1 = pIStack_548[6].super_Column_dimension_option.dim_;
  local_690 = (char *)CONCAT44(local_690._4_4_,iVar1);
  local_638[0] = iVar1 == 2;
  local_6a0 = (undefined4 **)CONCAT44(local_6a0._4_4_,2);
  local_630._0_8_ = 0;
  local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  local_6c8 = (undefined4 ****)0x1e62cd;
  local_6c0 = "";
  local_678 = (undefined **)&local_690;
  mr.matrix_._0_8_ = mr.matrix_._0_8_ & 0xffffffffffffff00;
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_002230a0;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  local_658 = &local_6a0;
  mc1.matrix_._0_8_ = mc1.matrix_._0_8_ & 0xffffffffffffff00;
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_002230a0;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _0_8_ = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_658;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_678;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_630.super_Chain_vine_swap_option);
  mc1.matrix_.super_Matrix_dimension_option.maxDim_ = 0;
  mc1.matrix_._4_4_ = 0;
  mc1.colSettings_ = (Column_settings *)birth_comp;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = std::
              _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
              ::_M_manager;
  mc2.matrix_.super_Matrix_dimension_option.maxDim_ = 0;
  mc2.matrix_._4_4_ = 0;
  mc2.colSettings_ = (Column_settings *)death_comp;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = std::
              _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
              ::_M_manager;
  mr.colSettings_ = (Column_settings *)operator_new(0x38);
  ((mr.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((mr.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((mr.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((mr.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x30;
  ((mr.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((mr.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((mr.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>
  ::
  Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>
              *)&mr.matrix_,5,mr.colSettings_,(function<bool_(unsigned_int,_unsigned_int)> *)&mc1,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mc2);
  if (mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_object != (void *)0x0) {
    (*mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_function_pointer)(&mc2,&mc2,3);
  }
  if (mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_object != (void *)0x0) {
    (*mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_function_pointer)(&mc1,&mc1,3);
  }
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_158,0x169);
  local_630._0_8_ = local_630._0_8_ & 0xffffffffffffff00;
  local_638 = (undefined1  [8])&PTR__lazy_ostream_002230e0;
  local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       (long)"  " + 2;
  local_6a0 = (undefined4 **)CONCAT44(local_6a0._4_4_,mr.matrix_.nextIndex_);
  local_690 = (char *)&local_6d8;
  local_6c8 = (undefined4 ****)CONCAT71(local_6c8._1_7_,mr.matrix_.nextIndex_ == 0);
  local_6d8 = (Index *)((ulong)local_6d8._4_4_ << 0x20);
  local_6c0 = (char *)0x0;
  sStack_6b8.pi_ = (sp_counted_base *)0x0;
  local_678 = (undefined **)0x1e62cd;
  local_670 = "";
  local_658 = &local_6a0;
  mc1.matrix_._0_8_ = mc1.matrix_._0_8_ & 0xffffffffffffff00;
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00223050;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _0_8_ = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_658;
  mc2.matrix_._0_8_ = mc2.matrix_._0_8_ & 0xffffffffffffff00;
  mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_002230a0;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _0_8_ = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_690;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_6b8);
  mc1.colSettings_ = (Column_settings *)operator_new(0x38);
  ((mc1.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((mc1.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((mc1.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((mc1.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x30;
  ((mc1.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((mc1.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((mc1.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
  ::Chain_matrix(&mc1.matrix_,
                 (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                  *)local_598,mc1.colSettings_);
  mc2.colSettings_ = (Column_settings *)operator_new(0x38);
  ((mc2.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((mc2.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((mc2.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((mc2.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x30;
  ((mc2.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((mc2.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((mc2.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
  ::Chain_matrix(&mc2.matrix_,
                 (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                  *)local_598,mc2.colSettings_);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_178,0x16e);
  local_670 = (char *)((ulong)local_670 & 0xffffffffffffff00);
  local_678 = &PTR__lazy_ostream_002230e0;
  local_668 = &boost::unit_test::lazy_ostream::inst;
  local_660 = (undefined4 **)0x1e624b;
  local_6a0 = &local_6d0;
  local_6d8 = &local_6dc;
  local_6dc = 7;
  local_650 = 0;
  sStack_648.pi_ = (sp_counted_base *)0x0;
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_688 = "";
  local_630._0_8_ = local_630._0_8_ & 0xffffffffffffff00;
  local_638 = (undefined1  [8])&PTR__lazy_ostream_00223050;
  local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_6a0;
  local_6c0 = (char *)((ulong)local_6c0 & 0xffffffffffffff00);
  local_6c8 = (undefined4 ****)&PTR__lazy_ostream_002230a0;
  sStack_6b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_6b0 = &local_6d8;
  local_658._0_1_ = mc1.matrix_.nextIndex_ == 7;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_648);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_198,0x16f);
  local_670 = (char *)((ulong)local_670 & 0xffffffffffffff00);
  local_678 = &PTR__lazy_ostream_002230e0;
  local_668 = &boost::unit_test::lazy_ostream::inst;
  local_660 = (undefined4 **)0x1e624b;
  local_6d0._0_4_ =
       mc1.matrix_.matrix_.
       super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[2].super_Column_dimension_option.dim_;
  local_658._0_1_ = (int)local_6d0 == 0;
  local_6dc = 0;
  local_650 = 0;
  sStack_648.pi_ = (sp_counted_base *)0x0;
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_688 = "";
  local_6a0 = &local_6d0;
  local_630._0_8_ = local_630._0_8_ & 0xffffffffffffff00;
  local_638 = (undefined1  [8])&PTR__lazy_ostream_002230a0;
  local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_6a0;
  local_6d8 = &local_6dc;
  local_6c0 = (char *)((ulong)local_6c0 & 0xffffffffffffff00);
  local_6c8 = (undefined4 ****)&PTR__lazy_ostream_002230a0;
  sStack_6b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_6b0 = &local_6d8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_648);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b8,0x170);
  local_670 = (char *)((ulong)local_670 & 0xffffffffffffff00);
  local_678 = &PTR__lazy_ostream_002230e0;
  local_668 = &boost::unit_test::lazy_ostream::inst;
  local_660 = (undefined4 **)0x1e624b;
  local_6d0._0_4_ =
       mc1.matrix_.matrix_.
       super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[6].super_Column_dimension_option.dim_;
  local_658._0_1_ = (int)local_6d0 == 2;
  local_6dc = 2;
  local_650 = 0;
  sStack_648.pi_ = (sp_counted_base *)0x0;
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_688 = "";
  local_6a0 = &local_6d0;
  local_630._0_8_ = local_630._0_8_ & 0xffffffffffffff00;
  local_638 = (undefined1  [8])&PTR__lazy_ostream_002230a0;
  local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_6a0;
  local_6d8 = &local_6dc;
  local_6c0 = (char *)((ulong)local_6c0 & 0xffffffffffffff00);
  local_6c8 = (undefined4 ****)&PTR__lazy_ostream_002230a0;
  sStack_6b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_6b0 = &local_6d8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_648);
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0x171);
  local_670 = (char *)((ulong)local_670 & 0xffffffffffffff00);
  local_678 = &PTR__lazy_ostream_002230e0;
  local_668 = &boost::unit_test::lazy_ostream::inst;
  local_660 = (undefined4 **)0x1e624b;
  local_658._0_1_ = mc2.matrix_.nextIndex_ == 7;
  local_6dc = 7;
  local_650 = 0;
  sStack_648.pi_ = (sp_counted_base *)0x0;
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_688 = "";
  local_6a0 = &local_6d0;
  local_630._0_8_ = local_630._0_8_ & 0xffffffffffffff00;
  local_638 = (undefined1  [8])&PTR__lazy_ostream_00223050;
  local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_6a0;
  local_6d8 = &local_6dc;
  local_6c0 = (char *)((ulong)local_6c0 & 0xffffffffffffff00);
  local_6c8 = (undefined4 ****)&PTR__lazy_ostream_002230a0;
  sStack_6b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_6b0 = &local_6d8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_648);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f8,0x172);
  local_670 = (char *)((ulong)local_670 & 0xffffffffffffff00);
  local_678 = &PTR__lazy_ostream_002230e0;
  local_668 = &boost::unit_test::lazy_ostream::inst;
  local_660 = (undefined4 **)0x1e624b;
  local_6d0._0_4_ =
       mc2.matrix_.matrix_.
       super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[2].super_Column_dimension_option.dim_;
  local_658._0_1_ = (int)local_6d0 == 0;
  local_6dc = 0;
  local_650 = 0;
  sStack_648.pi_ = (sp_counted_base *)0x0;
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_688 = "";
  local_6a0 = &local_6d0;
  local_630._0_8_ = local_630._0_8_ & 0xffffffffffffff00;
  local_638 = (undefined1  [8])&PTR__lazy_ostream_002230a0;
  local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_6a0;
  local_6d8 = &local_6dc;
  local_6c0 = (char *)((ulong)local_6c0 & 0xffffffffffffff00);
  local_6c8 = (undefined4 ****)&PTR__lazy_ostream_002230a0;
  sStack_6b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_6b0 = &local_6d8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_648);
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_218,0x173);
  local_670 = (char *)((ulong)local_670 & 0xffffffffffffff00);
  local_678 = &PTR__lazy_ostream_002230e0;
  local_668 = &boost::unit_test::lazy_ostream::inst;
  local_660 = (undefined4 **)0x1e624b;
  iVar1 = mc2.matrix_.matrix_.
          super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[6].super_Column_dimension_option.dim_;
  local_6d0 = (undefined4 *)CONCAT44(local_6d0._4_4_,iVar1);
  local_658 = (undefined4 ***)CONCAT71(local_658._1_7_,iVar1 == 2);
  local_6dc = 2;
  local_650 = 0;
  sStack_648.pi_ = (sp_counted_base *)0x0;
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_688 = "";
  local_6a0 = &local_6d0;
  local_630._0_8_ = local_630._0_8_ & 0xffffffffffffff00;
  local_638 = (undefined1  [8])&PTR__lazy_ostream_002230a0;
  local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_6a0;
  local_6d8 = &local_6dc;
  local_6c0 = (char *)((ulong)local_6c0 & 0xffffffffffffff00);
  local_6c8 = (undefined4 ****)&PTR__lazy_ostream_002230a0;
  sStack_6b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_6b0 = &local_6d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_658,&local_678,&local_690,0x173,1,2,2,"mc2.get_column_dimension(6)",local_638,
             "2",&local_6c8);
  boost::detail::shared_count::~shared_count(&sStack_648);
  local_630.colSettings_ = local_510;
  local_630.nextIndex_ = local_518;
  local_630.super_Matrix_row_access_option.rows_ = local_550.rows_;
  local_638 = local_5a0;
  local_5a0 = (undefined1  [8])0x0;
  uVar3 = local_598._0_4_;
  local_598._0_4_ = 0xffffffff;
  local_630.super_Matrix_dimension_option.maxDim_ = uVar3;
  local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (_Manager_type)0x0;
  local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       (undefined4 *****)0x0;
  local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x0;
  local_630.super_Chain_vine_swap_option.birthComp_._M_invoker = p_Stack_578;
  if (local_580 != (_Manager_type)0x0) {
    local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
    _M_object = (void *)local_590._0_8_;
    local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
         local_590._8_8_;
    local_630.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager = local_580;
    local_580 = (_Manager_type)0x0;
    p_Stack_578 = (_Invoker_type)0x0;
  }
  local_630.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  local_630.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor._8_8_ = 0;
  local_630.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_manager =
       (_Manager_type)0x0;
  local_630.super_Chain_vine_swap_option.deathComp_._M_invoker = p_Stack_558;
  if (local_560 != (_Manager_type)0x0) {
    local_630.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor._M_unused.
    _M_object = local_570._M_unused._M_object;
    local_630.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor._8_8_ =
         local_570._8_8_;
    local_630.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_manager = local_560;
    local_560 = (_Manager_type)0x0;
    p_Stack_558 = (_Invoker_type)0x0;
  }
  local_550.rows_ =
       (map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
        *)0x0;
  local_630.matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pIStack_548;
  local_630.matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = (undefined4)local_540;
  local_630.matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = local_540._4_4_;
  local_630.matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)uStack_538;
  local_630.matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = uStack_538._4_4_;
  uStack_538 = (pointer)0x0;
  pIStack_548 = (pointer)0x0;
  local_540 = (pointer)0x0;
  local_630.pivotToColumnIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = (undefined4)local_530;
  local_630.pivotToColumnIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start._4_4_ = local_530._4_4_;
  local_630.pivotToColumnIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = (undefined4)uStack_528;
  local_630.pivotToColumnIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish._4_4_ = uStack_528._4_4_;
  local_630.pivotToColumnIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_520;
  local_520 = (pointer)0x0;
  local_530 = (pointer)0x0;
  uStack_528 = (pointer)0x0;
  local_518 = 0;
  local_510 = (Column_settings *)0x0;
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_238,0x177);
  local_650 = local_650 & 0xffffffffffffff00;
  local_658 = (undefined4 ***)&PTR__lazy_ostream_002230e0;
  sStack_648.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_640 = "";
  local_6dc = local_630.nextIndex_;
  local_6a4 = 7;
  local_688 = (char *)0x0;
  sStack_680.pi_ = (sp_counted_base *)0x0;
  local_6a0 = (undefined4 **)0x1e62cd;
  local_698 = "";
  local_6d8 = &local_6dc;
  local_6c0 = (char *)((ulong)local_6c0 & 0xffffffffffffff00);
  local_6c8 = (undefined4 ****)&PTR__lazy_ostream_00223050;
  sStack_6b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_6b0 = &local_6d8;
  local_670 = (char *)((ulong)local_670 & 0xffffffffffffff00);
  local_678 = &PTR__lazy_ostream_002230a0;
  local_668 = &boost::unit_test::lazy_ostream::inst;
  local_660 = &local_6d0;
  local_6d0 = &local_6a4;
  local_690._0_1_ = local_630.nextIndex_ == 7;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_680);
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_258,0x178);
  local_650 = local_650 & 0xffffffffffffff00;
  local_658 = (undefined4 ***)&PTR__lazy_ostream_002230e0;
  sStack_648.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_640 = "";
  local_6dc = local_630.matrix_.
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2].super_Column_dimension_option.dim_;
  local_690._0_1_ = local_6dc == 0;
  local_6a4 = 0;
  local_688 = (char *)0x0;
  sStack_680.pi_ = (sp_counted_base *)0x0;
  local_6a0 = (undefined4 **)0x1e62cd;
  local_698 = "";
  local_6d8 = &local_6dc;
  local_6c0 = (char *)((ulong)local_6c0 & 0xffffffffffffff00);
  local_6c8 = (undefined4 ****)&PTR__lazy_ostream_002230a0;
  sStack_6b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_6b0 = &local_6d8;
  local_670 = (char *)((ulong)local_670 & 0xffffffffffffff00);
  local_678 = &PTR__lazy_ostream_002230a0;
  local_668 = &boost::unit_test::lazy_ostream::inst;
  local_660 = &local_6d0;
  local_6d0 = &local_6a4;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_680);
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_278,0x179);
  local_650 = local_650 & 0xffffffffffffff00;
  local_658 = (undefined4 ***)&PTR__lazy_ostream_002230e0;
  sStack_648.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_640 = "";
  local_6dc = local_630.matrix_.
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[6].super_Column_dimension_option.dim_;
  local_690._0_1_ = local_6dc == 2;
  local_6a4 = 2;
  local_688 = (char *)0x0;
  sStack_680.pi_ = (sp_counted_base *)0x0;
  local_6a0 = (undefined4 **)0x1e62cd;
  local_698 = "";
  local_6d8 = &local_6dc;
  local_6c0 = (char *)((ulong)local_6c0 & 0xffffffffffffff00);
  local_6c8 = (undefined4 ****)&PTR__lazy_ostream_002230a0;
  sStack_6b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_6b0 = &local_6d8;
  local_670 = (char *)((ulong)local_670 & 0xffffffffffffff00);
  local_678 = &PTR__lazy_ostream_002230a0;
  local_668 = &boost::unit_test::lazy_ostream::inst;
  local_660 = &local_6d0;
  local_6d0 = &local_6a4;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_680);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_298,0x17a);
  local_650 = local_650 & 0xffffffffffffff00;
  local_658 = (undefined4 ***)&PTR__lazy_ostream_002230e0;
  sStack_648.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_640 = "";
  local_6dc = local_518;
  local_690._0_1_ = local_518 == 0;
  local_6a4 = 0;
  local_688 = (char *)0x0;
  sStack_680.pi_ = (sp_counted_base *)0x0;
  local_6a0 = (undefined4 **)0x1e62cd;
  local_698 = "";
  local_6d8 = &local_6dc;
  local_6c0 = (char *)((ulong)local_6c0 & 0xffffffffffffff00);
  local_6c8 = (undefined4 ****)&PTR__lazy_ostream_00223050;
  sStack_6b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_6b0 = &local_6d8;
  local_670 = (char *)((ulong)local_670 & 0xffffffffffffff00);
  local_678 = &PTR__lazy_ostream_002230a0;
  local_668 = &boost::unit_test::lazy_ostream::inst;
  local_660 = &local_6d0;
  local_6d0 = &local_6a4;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_680);
  Gudhi::persistence_matrix::swap
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
              *)(local_638 + 8),
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
              *)local_598);
  auVar2 = local_638;
  local_638 = local_5a0;
  local_5a0 = auVar2;
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b8,0x17e);
  local_650 = local_650 & 0xffffffffffffff00;
  local_658 = (undefined4 ***)&PTR__lazy_ostream_002230e0;
  sStack_648.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_640 = "";
  local_6dc = local_630.nextIndex_;
  local_690._0_1_ = local_630.nextIndex_ == 0;
  local_6a4 = 0;
  local_688 = (char *)0x0;
  sStack_680.pi_ = (sp_counted_base *)0x0;
  local_6a0 = (undefined4 **)0x1e62cd;
  local_698 = "";
  local_6d8 = &local_6dc;
  local_6c0 = (char *)((ulong)local_6c0 & 0xffffffffffffff00);
  local_6c8 = (undefined4 ****)&PTR__lazy_ostream_00223050;
  sStack_6b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_6b0 = &local_6d8;
  local_670 = (char *)((ulong)local_670 & 0xffffffffffffff00);
  local_678 = &PTR__lazy_ostream_002230a0;
  local_668 = &boost::unit_test::lazy_ostream::inst;
  local_660 = &local_6d0;
  local_6d0 = &local_6a4;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_680);
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2d8,0x17f);
  local_650 = local_650 & 0xffffffffffffff00;
  local_658 = (undefined4 ***)&PTR__lazy_ostream_002230e0;
  sStack_648.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_640 = "";
  local_6dc = local_518;
  local_690._0_1_ = local_518 == 7;
  local_6a4 = 7;
  local_688 = (char *)0x0;
  sStack_680.pi_ = (sp_counted_base *)0x0;
  local_6a0 = (undefined4 **)0x1e62cd;
  local_698 = "";
  local_6d8 = &local_6dc;
  local_6c0 = (char *)((ulong)local_6c0 & 0xffffffffffffff00);
  local_6c8 = (undefined4 ****)&PTR__lazy_ostream_00223050;
  sStack_6b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_6b0 = &local_6d8;
  local_670 = (char *)((ulong)local_670 & 0xffffffffffffff00);
  local_678 = &PTR__lazy_ostream_002230a0;
  local_668 = &boost::unit_test::lazy_ostream::inst;
  local_660 = &local_6d0;
  local_6d0 = &local_6a4;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_680);
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f8,0x180);
  local_650 = local_650 & 0xffffffffffffff00;
  local_658 = (undefined4 ***)&PTR__lazy_ostream_002230e0;
  sStack_648.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_640 = "";
  local_6dc = pIStack_548[2].super_Column_dimension_option.dim_;
  local_690._0_1_ = local_6dc == 0;
  local_6a4 = 0;
  local_688 = (char *)0x0;
  sStack_680.pi_ = (sp_counted_base *)0x0;
  local_6a0 = (undefined4 **)0x1e62cd;
  local_698 = "";
  local_6d8 = &local_6dc;
  local_6c0 = (char *)((ulong)local_6c0 & 0xffffffffffffff00);
  local_6c8 = (undefined4 ****)&PTR__lazy_ostream_002230a0;
  sStack_6b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_6b0 = &local_6d8;
  local_670 = (char *)((ulong)local_670 & 0xffffffffffffff00);
  local_678 = &PTR__lazy_ostream_002230a0;
  local_668 = &boost::unit_test::lazy_ostream::inst;
  local_660 = &local_6d0;
  local_6d0 = &local_6a4;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_680);
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_310 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_318,0x181);
  local_650 = local_650 & 0xffffffffffffff00;
  local_658 = (undefined4 ***)&PTR__lazy_ostream_002230e0;
  sStack_648.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_640 = "";
  local_6dc = pIStack_548[6].super_Column_dimension_option.dim_;
  local_690 = (char *)CONCAT71(local_690._1_7_,local_6dc == 2);
  local_6a4 = 2;
  local_688 = (char *)0x0;
  sStack_680.pi_ = (sp_counted_base *)0x0;
  local_6a0 = (undefined4 **)0x1e62cd;
  local_698 = "";
  local_6d8 = &local_6dc;
  local_6c0 = (char *)((ulong)local_6c0 & 0xffffffffffffff00);
  local_6c8 = (undefined4 ****)&PTR__lazy_ostream_002230a0;
  sStack_6b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_6b0 = &local_6d8;
  local_670 = (char *)((ulong)local_670 & 0xffffffffffffff00);
  local_678 = &PTR__lazy_ostream_002230a0;
  local_668 = &boost::unit_test::lazy_ostream::inst;
  local_660 = &local_6d0;
  local_6d0 = &local_6a4;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_680);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>
  ::~Matrix((Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>
             *)local_638);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>
  ::~Matrix(&mc2);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>
  ::~Matrix(&mc1);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>
  ::~Matrix(&mr);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>
  ::~Matrix((Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>
             *)local_5a0);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>
  ::~Matrix(&m);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&ordered_boundaries);
  return;
}

Assistant:

void test_chain_constructors() {
  auto ordered_boundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  // default constructor
  Matrix m(birth_comp, death_comp);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 0);

  // constructor from given @ref boundarymatrix "boundary matrix"
  Matrix mb(ordered_boundaries, birth_comp, death_comp, 5);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(6), 2);

  // constructor reserving column space
  Matrix mr(5, birth_comp, death_comp);
  BOOST_CHECK_EQUAL(mr.get_number_of_columns(), 0);

  // copy constructor
  Matrix mc1(mb);
  Matrix mc2 = mb;
  BOOST_CHECK_EQUAL(mc1.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mc1.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mc1.get_column_dimension(6), 2);
  BOOST_CHECK_EQUAL(mc2.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mc2.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mc2.get_column_dimension(6), 2);

  // move constructor
  Matrix mm(std::move(mb));
  BOOST_CHECK_EQUAL(mm.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mm.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mm.get_column_dimension(6), 2);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 0);

  // swap
  swap(mm, mb);
  BOOST_CHECK_EQUAL(mm.get_number_of_columns(), 0);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(6), 2);
}